

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  long lVar1;
  ulong uVar2;
  Slice SVar3;
  
  lVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar2 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
    SVar3 = ExtractUserKey((Slice *)((long)&keys->data_ + lVar1));
    *(char **)((long)&keys->data_ + lVar1) = SVar3.data_;
    *(size_t *)((long)&keys->size_ + lVar1) = SVar3.size_;
  }
  (*this->user_policy_->_vptr_FilterPolicy[3])(this->user_policy_,keys,(ulong)(uint)n,dst);
  return;
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}